

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::CreateDataPropertyOrThrow
          (JavascriptArray *this,RecyclableObject *obj,BigIndex index,Var item,
          ScriptContext *scriptContext)

{
  undefined1 uVar1;
  uint64 uVar2;
  bool bVar3;
  uint uVar4;
  JavascriptArray *arr;
  undefined8 uVar5;
  Var aItem;
  BigIndex index_00;
  undefined1 local_70 [8];
  BigIndex index_local;
  JsReentLock jsReentLock;
  
  uVar5 = index._0_8_;
  local_70._0_4_ = SUB84(obj,0);
  uVar2 = *(uint64 *)((long)item + 0x3b8);
  uVar1 = *(undefined1 *)(uVar2 + 0x108);
  *(undefined1 *)(uVar2 + 0x108) = 1;
  aItem = item;
  index_local._0_8_ = uVar5;
  index_local.bigIndex = uVar2;
  bVar3 = IsNonES5Array(this);
  if (bVar3) {
    arr = UnsafeVarTo<Js::JavascriptArray>(this);
    if (arr != (JavascriptArray *)0x0) {
      BigIndex::SetItem((BigIndex *)local_70,arr,(Var)index.bigIndex);
      index_local.bigIndex = uVar2;
      goto LAB_00b71c99;
    }
  }
  *(undefined1 *)(uVar2 + 0x108) = uVar1;
  uVar4 = SetArrayLikeObjects(this,(RecyclableObject *)((ulong)obj & 0xffffffff),index,aItem);
  index_00.bigIndex = (uint64)aItem;
  index_00.index = (uint32)uVar5;
  index_00._4_4_ = SUB84(uVar5,4);
  ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar4,(BOOL)item,
                      (ScriptContext *)((ulong)obj & 0xffffffff),index_00);
  JsReentLock::MutateArrayObject((JsReentLock *)&index_local.bigIndex);
  *(undefined1 *)(index_local.bigIndex + 0x108) = 1;
LAB_00b71c99:
  *(undefined1 *)(index_local.bigIndex + 0x108) = uVar1;
  return;
}

Assistant:

void JavascriptArray::CreateDataPropertyOrThrow(RecyclableObject * obj, BigIndex index, Var item, ScriptContext * scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(obj);
        if (arr != nullptr)
        {
            arr->GenericDirectSetItemAt(index, item);
        }
        else
        {
            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(obj, index, item), scriptContext, index));
        }
    }